

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

appender fmt::v9::detail::
         do_write_float<fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<double>,char,fmt::v9::detail::digit_grouping<char>>
                   (appender out,decimal_fp<double> *f,basic_format_specs<char> *specs,
                   float_specs fspecs,locale_ref loc)

{
  byte bVar1;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> bVar2;
  appender aVar3;
  byte *pbVar4;
  byte *pbVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  size_t sVar11;
  ulong uVar12;
  char decimal_point;
  sign_t sign;
  char zero;
  bool pointy;
  int significand_size;
  int exp;
  significand_type significand;
  int num_zeros;
  anon_class_40_8_dbbf3351 write;
  undefined1 local_bf [11];
  undefined4 uStack_b4;
  int local_b0;
  undefined1 local_ac [20];
  long local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  char local_80;
  anon_class_72_9_0c6a3a8a local_78;
  
  local_ac._4_8_ = f->significand;
  lVar10 = 0x3f;
  if ((local_ac._4_8_ | 1) != 0) {
    for (; (local_ac._4_8_ | 1) >> lVar10 == 0; lVar10 = lVar10 + -1) {
    }
  }
  local_b0 = (uint)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar10] -
             (uint)((ulong)local_ac._4_8_ <
                   *(significand_type **)
                    (do_count_digits(unsigned_long)::zero_or_powers_of_10 +
                    (ulong)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar10] * 8));
  local_bf[2] = 0x30;
  uStack_b4 = fspecs._4_4_;
  local_bf[1] = fspecs._5_1_;
  uVar12 = (ulong)((local_b0 + 1) - (uint)(local_bf[1] == '\0'));
  local_bf[0] = '.';
  uVar8 = uStack_b4 >> 0x11;
  unique0x10000510 = fspecs;
  if ((uVar8 & 1) != 0) {
    local_bf[0] = decimal_point_impl<char>(loc);
  }
  uVar8 = f->exponent;
  local_ac._0_4_ = local_b0 + uVar8;
  if (local_bf[0xb] == '\x01') {
LAB_00122ef6:
    iVar7 = local_b0 + uVar8 + -1;
    if ((uStack_b4 >> 0x13 & 1) == 0) {
      uVar6 = 0;
      if (local_b0 == 1) {
        local_bf[0] = '\0';
      }
    }
    else {
      uVar6 = 0;
      if (0 < local_bf._7_4_ - local_b0) {
        uVar6 = (ulong)(uint)(local_bf._7_4_ - local_b0);
      }
      uVar12 = uVar12 + uVar6;
    }
    local_78.sign = (sign_t *)CONCAT71(local_78.sign._1_7_,local_bf[1]);
    local_78.significand = (significand_type *)local_ac._4_8_;
    local_78.significand_size._0_5_ = CONCAT14(local_bf[0],local_b0);
    local_78.f._0_5_ = CONCAT14(0x30,(int)uVar6);
    local_78.f = (decimal_fp<double> *)
                 (CONCAT26(local_78.f._6_2_,
                           CONCAT15(((uStack_b4 >> 0x10 & 1) == 0) << 5,local_78.f._0_5_)) |
                 0x450000000000);
    local_78.grouping = (digit_grouping<char> *)CONCAT44(local_78.grouping._4_4_,iVar7);
    if (specs->width < 1) {
      bVar2.container =
           (buffer<char> *)
           do_write_float<fmt::v9::appender,_fmt::v9::detail::dragonbox::decimal_fp<double>,_char,_fmt::v9::detail::digit_grouping<char>_>
           ::anon_class_40_8_dbbf3351::operator()
                     ((anon_class_40_8_dbbf3351 *)&local_78,
                      out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container);
    }
    else {
      if ((int)local_ac._0_4_ < 1) {
        iVar7 = 1 - local_ac._0_4_;
      }
      lVar10 = 2;
      if (99 < iVar7) {
        lVar10 = (ulong)(999 < iVar7) + 3;
      }
      sVar11 = uVar12 + lVar10 + (3 - (ulong)(local_bf[0] == '\0'));
      bVar2.container =
           (buffer<char> *)
           write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::do_write_float<fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<double>,char,fmt::v9::detail::digit_grouping<char>>(fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<double>const&,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::float_specs,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_1_&>
                     (out,specs,sVar11,sVar11,(anon_class_40_8_dbbf3351 *)&local_78);
    }
  }
  else {
    if (((ulong)stack0xffffffffffffff48 & 0xff00000000) == 0) {
      iVar7 = 0x10;
      if (0 < (int)local_bf._7_4_) {
        iVar7 = local_bf._7_4_;
      }
      if (((int)local_ac._0_4_ < -3) || (iVar7 < (int)local_ac._0_4_)) goto LAB_00122ef6;
    }
    if ((int)uVar8 < 0) {
      if ((int)local_ac._0_4_ < 1) {
        iVar7 = -local_ac._0_4_;
        local_ac._12_4_ = iVar7;
        if (SBORROW4(local_bf._7_4_,iVar7) != (int)(local_bf._7_4_ + local_ac._0_4_) < 0) {
          local_ac._12_4_ = local_bf._7_4_;
        }
        if ((int)local_bf._7_4_ < 0) {
          local_ac._12_4_ = iVar7;
        }
        if (local_b0 != 0) {
          local_ac._12_4_ = iVar7;
        }
        bVar1 = 1;
        if (local_b0 == 0 && local_ac._12_4_ == 0) {
          bVar1 = (uStack_b4._2_1_ & 8) >> 3;
        }
        local_78.significand_size = (int *)(local_bf + 3);
        local_bf[3] = bVar1;
        sVar11 = ((uint)bVar1 + local_ac._12_4_ + 1) + uVar12;
        local_78.sign = local_bf + 1;
        local_78.significand = (significand_type *)(local_bf + 2);
        local_78.f = (decimal_fp<double> *)local_bf;
        local_78.grouping = (digit_grouping<char> *)(local_ac + 0xc);
        local_78.fspecs = (float_specs *)(local_ac + 4);
        local_78.decimal_point = (char *)&local_b0;
        aVar3 = write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::do_write_float<fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<double>,char,fmt::v9::detail::digit_grouping<char>>(fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<double>const&,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::float_specs,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_4_&>
                          (out,specs,sVar11,sVar11,(anon_class_56_7_162c6e41 *)&local_78);
        return (back_insert_iterator<fmt::v9::detail::buffer<char>_>)
               aVar3.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
      }
      uVar8 = local_bf._7_4_ - local_b0 & (int)(uStack_b4 << 0xc) >> 0x1f;
      local_bf._3_4_ = uVar8;
      digit_grouping<char>::digit_grouping
                ((digit_grouping<char> *)(local_ac + 0xc),loc,(bool)((byte)(uStack_b4 >> 0x11) & 1))
      ;
      pbVar4 = (byte *)CONCAT44(local_ac._16_4_,local_ac._12_4_);
      pbVar5 = pbVar4 + local_98;
      iVar7 = 0;
      if ((int)uVar8 < 1) {
        uVar8 = 0;
      }
      sVar11 = uVar8 + uVar12;
      do {
        iVar9 = 0x7fffffff;
        if (local_80 != '\0') {
          if (pbVar4 == pbVar5) {
            uVar8 = (uint)(char)pbVar5[-1];
          }
          else {
            bVar1 = *pbVar4;
            if ((byte)(bVar1 + 0x81) < 0x82) goto LAB_00123061;
            pbVar4 = pbVar4 + 1;
            uVar8 = (uint)bVar1;
          }
          iVar7 = iVar7 + uVar8;
          iVar9 = iVar7;
        }
LAB_00123061:
        sVar11 = sVar11 + 1;
      } while (iVar9 < local_b0);
      local_78.sign = local_bf + 1;
      local_78.significand = (significand_type *)(local_ac + 4);
      local_78.significand_size = &local_b0;
      local_78.f = (decimal_fp<double> *)local_ac;
      local_78.grouping = (digit_grouping<char> *)local_bf;
      local_78.decimal_point = local_bf + 3;
      local_78.num_zeros = (int *)(local_bf + 2);
      local_78.fspecs = (float_specs *)(local_ac + 0xc);
      bVar2.container =
           (buffer<char> *)
           write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::do_write_float<fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<double>,char,fmt::v9::detail::digit_grouping<char>>(fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<double>const&,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::float_specs,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_3_&>
                     (out,specs,sVar11,sVar11,(anon_class_64_8_e6ffa566 *)&local_78);
    }
    else {
      lVar10 = uVar8 + uVar12;
      local_bf._3_4_ = local_bf._7_4_ - local_ac._0_4_;
      if ((uStack_b4 >> 0x13 & 1) != 0) {
        if (local_bf[0xb] != '\x02' && (int)local_bf._3_4_ < 1) {
          local_bf._3_4_ = 1;
        }
        lVar10 = lVar10 + 1;
        if (0 < (long)(int)local_bf._3_4_) {
          lVar10 = lVar10 + (int)local_bf._3_4_;
        }
      }
      digit_grouping<char>::digit_grouping
                ((digit_grouping<char> *)(local_ac + 0xc),loc,(bool)((byte)(uStack_b4 >> 0x11) & 1))
      ;
      pbVar4 = (byte *)CONCAT44(local_ac._16_4_,local_ac._12_4_);
      pbVar5 = pbVar4 + local_98;
      sVar11 = lVar10 - 1;
      iVar7 = 0;
      do {
        iVar9 = 0x7fffffff;
        if (local_80 != '\0') {
          if (pbVar4 == pbVar5) {
            uVar8 = (uint)(char)pbVar5[-1];
          }
          else {
            bVar1 = *pbVar4;
            if ((byte)(bVar1 + 0x81) < 0x82) goto LAB_00122e8d;
            pbVar4 = pbVar4 + 1;
            uVar8 = (uint)bVar1;
          }
          iVar7 = iVar7 + uVar8;
          iVar9 = iVar7;
        }
LAB_00122e8d:
        sVar11 = sVar11 + 1;
      } while (iVar9 < (int)local_ac._0_4_);
      local_78.sign = local_bf + 1;
      local_78.significand = (significand_type *)(local_ac + 4);
      local_78.significand_size = &local_b0;
      local_78.fspecs = (float_specs *)(local_bf + 7);
      local_78.decimal_point = local_bf;
      local_78.num_zeros = (int *)(local_bf + 3);
      local_78.zero = local_bf + 2;
      local_78.f = f;
      local_78.grouping = (digit_grouping<char> *)(local_ac + 0xc);
      bVar2.container =
           (buffer<char> *)
           write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::do_write_float<fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<double>,char,fmt::v9::detail::digit_grouping<char>>(fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<double>const&,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::float_specs,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_2_&>
                     (out,specs,sVar11,sVar11,&local_78);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_ac._16_4_,local_ac._12_4_) != &local_90) {
      operator_delete((undefined1 *)CONCAT44(local_ac._16_4_,local_ac._12_4_),
                      local_90._M_allocated_capacity + 1);
    }
  }
  return (appender)(back_insert_iterator<fmt::v9::detail::buffer<char>_>)bVar2.container;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& f,
                                    const basic_format_specs<Char>& specs,
                                    float_specs fspecs, locale_ref loc)
    -> OutputIt {
  auto significand = f.significand;
  int significand_size = get_significand_size(f);
  const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point =
      fspecs.locale ? detail::decimal_point<Char>(loc) : static_cast<Char>('.');

  int output_exp = f.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = fspecs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = f.exponent + significand_size;
  if (f.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(f.exponent);
    int num_zeros = fspecs.precision - exp;
    abort_fuzzing_if(num_zeros > 5000);
    if (fspecs.showpoint) {
      ++size;
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand<Char>(it, significand, significand_size,
                                   f.exponent, grouping);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(significand_size));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || fspecs.showpoint;
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = detail::sign<Char>(sign);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}